

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

void __thiscall QFragmentMap<QTextBlockData>::clear(QFragmentMap<QTextBlockData> *this)

{
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextBlockData>_1 local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.head = (Header *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  ctx = (EVP_PKEY_CTX *)this;
  begin((QFragmentMap<QTextBlockData> *)&local_28);
  while (((ulong)puStack_20 & 0xffffffff) != 0) {
    QTextBlockData::free
              ((QTextBlockData *)(((ulong)puStack_20 & 0xffffffff) * 0x48 + *(long *)local_28.head),
               ctx);
    Iterator::operator++((Iterator *)&local_28);
  }
  QFragmentMapData<QTextBlockData>::init(&this->data,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void clear() {
        for (Iterator it = begin(); !it.atEnd(); ++it)
            it.value()->free();
        data.init();
    }